

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(ExtensionSet *this,int key)

{
  _Base_ptr p_Var1;
  Extension *pEVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  
  p_Var3 = &(((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = (((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < key]) {
    if (key <= (int)p_Var4[1]._M_color) {
      p_Var1 = p_Var4;
    }
  }
  p_Var4 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var4 = p_Var1, key < (int)p_Var1[1]._M_color)) {
    p_Var4 = &p_Var3->_M_header;
  }
  pEVar2 = (Extension *)0x0;
  if ((_Rb_tree_header *)p_Var4 != p_Var3) {
    pEVar2 = (Extension *)&p_Var4[1]._M_parent;
  }
  return pEVar2;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNullInLargeMap(
    int key) const {
  assert(is_large());
  LargeMap::const_iterator it = map_.large->find(key);
  if (it != map_.large->end()) {
    return &it->second;
  }
  return NULL;
}